

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

int xmlACatalogAdd(xmlCatalogPtr catal,xmlChar *type,xmlChar *orig,xmlChar *replace)

{
  _xmlCatalogEntry **pp_Var1;
  _xmlCatalogEntry *p_Var2;
  xmlGenericErrorFunc p_Var3;
  _xmlCatalogEntry *p_Var4;
  int iVar5;
  int iVar6;
  xmlCatalogEntryPtr pxVar7;
  xmlHashTablePtr pxVar8;
  xmlGenericErrorFunc *pp_Var9;
  void **ppvVar10;
  xmlCatalogEntryPtr pxVar11;
  void *pvVar12;
  xmlChar *pxVar13;
  _xmlCatalogEntry *p_Var14;
  xmlCatalogEntryType xVar15;
  
  iVar6 = -1;
  if (catal != (xmlCatalogPtr)0x0) {
    if (catal->type == XML_XML_CATALOG_TYPE) {
      pxVar7 = catal->xml;
      if ((pxVar7 != (xmlCatalogEntryPtr)0x0) && ((uint)(pxVar7->type + XML_CATA_REMOVED) < 2)) {
        pp_Var1 = &pxVar7->children;
        if (pxVar7->children == (_xmlCatalogEntry *)0x0) {
          xmlFetchXMLCatalogFile(pxVar7);
        }
        p_Var2 = *pp_Var1;
        iVar5 = xmlStrEqual(type,"system");
        xVar15 = XML_CATA_SYSTEM;
        if (iVar5 == 0) {
          iVar5 = xmlStrEqual(type,(xmlChar *)"public");
          xVar15 = XML_CATA_PUBLIC;
          if (iVar5 == 0) {
            iVar5 = xmlStrEqual(type,(xmlChar *)"rewriteSystem");
            xVar15 = XML_CATA_REWRITE_SYSTEM;
            if (iVar5 == 0) {
              iVar5 = xmlStrEqual(type,(xmlChar *)"delegatePublic");
              xVar15 = XML_CATA_DELEGATE_PUBLIC;
              if (iVar5 == 0) {
                iVar5 = xmlStrEqual(type,(xmlChar *)"delegateSystem");
                xVar15 = XML_CATA_DELEGATE_SYSTEM;
                if (iVar5 == 0) {
                  iVar5 = xmlStrEqual(type,"uri");
                  xVar15 = XML_CATA_URI;
                  if (iVar5 == 0) {
                    iVar5 = xmlStrEqual(type,(xmlChar *)"rewriteURI");
                    xVar15 = XML_CATA_REWRITE_URI;
                    if (iVar5 == 0) {
                      iVar5 = xmlStrEqual(type,(xmlChar *)"delegateURI");
                      xVar15 = XML_CATA_DELEGATE_URI;
                      if (iVar5 == 0) {
                        iVar5 = xmlStrEqual(type,(xmlChar *)"nextCatalog");
                        xVar15 = XML_CATA_NEXT_CATALOG;
                        if (iVar5 == 0) {
                          iVar5 = xmlStrEqual(type,"catalog");
                          xVar15 = (xmlCatalogEntryType)(iVar5 != 0);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (xVar15 == XML_CATA_NONE) {
          if (xmlDebugCatalogs != 0) {
            pp_Var9 = __xmlGenericError();
            p_Var3 = *pp_Var9;
            ppvVar10 = __xmlGenericErrorContext();
            (*p_Var3)(*ppvVar10,"Failed to add unknown element %s to catalog\n",type);
          }
        }
        else {
          p_Var4 = *pp_Var1;
          if (*pp_Var1 == (_xmlCatalogEntry *)0x0) {
            p_Var14 = (_xmlCatalogEntry *)0x0;
          }
          else {
            do {
              p_Var14 = p_Var4;
              if (((orig != (xmlChar *)0x0) && (p_Var14->type == xVar15)) &&
                 (iVar6 = xmlStrEqual(orig,p_Var14->name), iVar6 != 0)) {
                if (xmlDebugCatalogs != 0) {
                  pp_Var9 = __xmlGenericError();
                  p_Var3 = *pp_Var9;
                  ppvVar10 = __xmlGenericErrorContext();
                  (*p_Var3)(*ppvVar10,"Updating element %s to catalog\n",type);
                }
                if (p_Var14->value != (xmlChar *)0x0) {
                  (*xmlFree)(p_Var14->value);
                }
                if (p_Var14->URL != (xmlChar *)0x0) {
                  (*xmlFree)(p_Var14->URL);
                }
                pxVar13 = xmlStrdup(replace);
                p_Var14->value = pxVar13;
                pxVar13 = xmlStrdup(replace);
                p_Var14->URL = pxVar13;
                return 0;
              }
              p_Var4 = p_Var14->next;
            } while (p_Var14->next != (_xmlCatalogEntry *)0x0);
          }
          if (xmlDebugCatalogs != 0) {
            pp_Var9 = __xmlGenericError();
            p_Var3 = *pp_Var9;
            ppvVar10 = __xmlGenericErrorContext();
            (*p_Var3)(*ppvVar10,"Adding element %s to catalog\n",type);
          }
          pxVar11 = xmlNewCatalogEntry(xVar15,orig,replace,(xmlChar *)0x0,pxVar7->prefer,
                                       (xmlCatalogEntryPtr)0x0);
          if (p_Var14 == (_xmlCatalogEntry *)0x0) {
            p_Var14 = (_xmlCatalogEntry *)pp_Var1;
          }
          p_Var14->next = pxVar11;
          iVar6 = 0;
          if (p_Var2 == (_xmlCatalogEntry *)0x0) {
            pxVar7->type = XML_CATA_CATALOG;
            pvVar12 = xmlHashLookup(xmlCatalogXMLFiles,pxVar7->URL);
            if (pvVar12 != (void *)0x0) {
              *(_xmlCatalogEntry **)((long)pvVar12 + 0x10) = *pp_Var1;
              iVar6 = 0;
            }
          }
        }
      }
    }
    else {
      iVar5 = xmlStrEqual(type,"SYSTEM");
      xVar15 = SGML_CATA_SYSTEM;
      if (iVar5 == 0) {
        iVar5 = xmlStrEqual(type,(xmlChar *)"PUBLIC");
        xVar15 = SGML_CATA_PUBLIC;
        if (iVar5 == 0) {
          iVar5 = xmlStrEqual(type,(xmlChar *)"DELEGATE");
          xVar15 = SGML_CATA_DELEGATE;
          if (iVar5 == 0) {
            iVar5 = xmlStrEqual(type,"ENTITY");
            xVar15 = SGML_CATA_ENTITY;
            if (iVar5 == 0) {
              iVar5 = xmlStrEqual(type,(xmlChar *)"DOCTYPE");
              xVar15 = SGML_CATA_DOCTYPE;
              if (iVar5 == 0) {
                iVar5 = xmlStrEqual(type,(xmlChar *)"LINKTYPE");
                xVar15 = SGML_CATA_LINKTYPE;
                if (iVar5 == 0) {
                  iVar5 = xmlStrEqual(type,(xmlChar *)"NOTATION");
                  xVar15 = SGML_CATA_NOTATION;
                  if (iVar5 == 0) {
                    iVar5 = xmlStrEqual(type,(xmlChar *)"SGMLDECL");
                    xVar15 = SGML_CATA_SGMLDECL;
                    if (iVar5 == 0) {
                      iVar5 = xmlStrEqual(type,"DOCUMENT");
                      xVar15 = SGML_CATA_DOCUMENT;
                      if (iVar5 == 0) {
                        iVar5 = xmlStrEqual(type,"CATALOG");
                        xVar15 = SGML_CATA_CATALOG;
                        if (iVar5 == 0) {
                          iVar5 = xmlStrEqual(type,(xmlChar *)"BASE");
                          xVar15 = SGML_CATA_BASE;
                          if (iVar5 == 0) {
                            xVar15 = XML_CATA_NONE;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (xVar15 != XML_CATA_NONE) {
        pxVar7 = xmlNewCatalogEntry(xVar15,orig,replace,(xmlChar *)0x0,XML_CATA_PREFER_NONE,
                                    (xmlCatalogEntryPtr)0x0);
        if (catal->sgml == (xmlHashTablePtr)0x0) {
          pxVar8 = xmlHashCreate(10);
          catal->sgml = pxVar8;
        }
        iVar6 = xmlHashAddEntry(catal->sgml,orig,pxVar7);
        return iVar6;
      }
    }
  }
  return iVar6;
}

Assistant:

int
xmlACatalogAdd(xmlCatalogPtr catal, const xmlChar * type,
              const xmlChar * orig, const xmlChar * replace)
{
    int res = -1;

    if (catal == NULL)
	return(-1);

    if (catal->type == XML_XML_CATALOG_TYPE) {
        res = xmlAddXMLCatalog(catal->xml, type, orig, replace);
    } else {
        xmlCatalogEntryType cattype;

        cattype = xmlGetSGMLCatalogEntryType(type);
        if (cattype != XML_CATA_NONE) {
            xmlCatalogEntryPtr entry;

            entry = xmlNewCatalogEntry(cattype, orig, replace, NULL,
                                       XML_CATA_PREFER_NONE, NULL);
	    if (catal->sgml == NULL)
		catal->sgml = xmlHashCreate(10);
            res = xmlHashAddEntry(catal->sgml, orig, entry);
        }
    }
    return (res);
}